

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68000_addx_mm_16(m68k_info *info)

{
  int in_stack_00000014;
  uint8_t in_stack_0000001b;
  int in_stack_0000001c;
  m68k_info *in_stack_00000020;
  
  build_mm(in_stack_00000020,in_stack_0000001c,in_stack_0000001b,in_stack_00000014);
  return;
}

Assistant:

static void d68000_addx_mm_16(m68k_info *info)
{
	build_mm(info, M68K_INS_ADDX, 2, 0);
}